

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::TriangleDerivateCase::iterate(TriangleDerivateCase *this)

{
  Vec4 *vec;
  deUint32 *pdVar1;
  _Rb_tree_header *this_00;
  _Base_ptr *pp_Var2;
  undefined8 uVar3;
  DataType dataType;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  RenderContext *pRVar8;
  TestLog *pTVar9;
  size_type sVar10;
  int iVar11;
  deUint32 dVar12;
  GLenum GVar13;
  GLint GVar14;
  GLint GVar15;
  undefined4 extraout_var;
  char *pcVar17;
  mapped_type *pmVar18;
  Functions *__dest;
  TestError *pTVar19;
  RenderTarget *pRVar20;
  glUniform3fvFunc *pp_Var21;
  _Rb_tree_color _Var22;
  GLsizei width;
  ConstPixelBufferAccess *access;
  Surface *surface;
  void *__buf;
  void *__buf_00;
  char *pcVar23;
  byte bVar24;
  void *data;
  pointer *ppbVar25;
  long lVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  uint local_7fc;
  uint local_7f8;
  size_type __dnew;
  deUint32 local_7e8;
  undefined4 uStack_7e4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7e0;
  SurfaceType local_7cc;
  TextureFormat transferFormat;
  size_type local_7c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7b8;
  Vec4 *local_7a8;
  AutoRbo rbo;
  AutoFbo fbo;
  Surface errorMask;
  TextureLevel result;
  string local_738;
  Random rnd;
  ProgramSources sources;
  AutoRbo resRbo;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_578;
  undefined4 local_560;
  ios_base local_510 [264];
  AutoFbo resFbo;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  deUint32 local_3e8;
  undefined4 local_3e4;
  undefined8 local_3e0;
  undefined8 local_3d8;
  float local_3d0;
  float local_3cc;
  ios_base local_390 [264];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vertexParams;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258 [4];
  ios_base local_210 [272];
  ShaderProgram program;
  Functions *pFVar16;
  
  iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pFVar16 = (Functions *)CONCAT44(extraout_var,iVar11);
  pRVar8 = ((this->super_TestCase).m_context)->m_renderCtx;
  dataType = this->m_coordDataType;
  vertexParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vertexParams._M_t._M_impl.super__Rb_tree_header._M_header;
  vertexParams._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (ulong)(uint)vertexParams._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ << 0x20;
  vertexParams._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vertexParams._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  vertexParams._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vertexParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pcVar17 = glu::getPrecisionName(this->m_coordPrecision);
  resFbo.m_gl = (Functions *)&local_3f8;
  local_3f8._M_allocated_capacity = 0x4f49534943455250;
  local_3f8._8_2_ = 0x4e;
  resFbo.m_fbo = 9;
  resFbo._12_4_ = 0;
  pmVar18 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vertexParams,(key_type *)&resFbo);
  pcVar23 = (char *)pmVar18->_M_string_length;
  strlen(pcVar17);
  std::__cxx11::string::_M_replace((ulong)pmVar18,0,pcVar23,(ulong)pcVar17);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)resFbo.m_gl != &local_3f8) {
    operator_delete(resFbo.m_gl,local_3f8._M_allocated_capacity + 1);
  }
  pcVar17 = glu::getDataTypeName(dataType);
  resFbo.m_gl = (Functions *)&local_3f8;
  local_3f8._M_allocated_capacity = 0x4550595441544144;
  resFbo.m_fbo = 8;
  resFbo._12_4_ = 0;
  local_3f8._8_8_ = local_3f8._8_8_ & 0xffffffffffffff00;
  pmVar18 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vertexParams,(key_type *)&resFbo);
  pcVar23 = (char *)pmVar18->_M_string_length;
  strlen(pcVar17);
  std::__cxx11::string::_M_replace((ulong)pmVar18,0,pcVar23,(ulong)pcVar17);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)resFbo.m_gl != &local_3f8) {
    operator_delete(resFbo.m_gl,local_3f8._M_allocated_capacity + 1);
  }
  __dnew = 0xb9;
  resRbo.m_gl = (Functions *)&local_578;
  __dest = (Functions *)std::__cxx11::string::_M_create((ulong *)&resRbo,(ulong)&__dnew);
  sVar10 = __dnew;
  local_578._M_allocated_capacity = __dnew;
  resRbo.m_gl = __dest;
  memcpy(__dest,
         "#version 300 es\nin highp vec4 a_position;\nin ${PRECISION} ${DATATYPE} a_coord;\nout ${PRECISION} ${DATATYPE} v_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
         ,0xb9);
  resRbo._8_8_ = sVar10;
  *(undefined1 *)((long)&__dest->activeShaderProgram + sVar10) = 0;
  tcu::StringTemplate::StringTemplate((StringTemplate *)&resFbo,(string *)&resRbo);
  tcu::StringTemplate::specialize((string *)&result,(StringTemplate *)&resFbo,&vertexParams);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&resFbo);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)resRbo.m_gl != &local_578) {
    operator_delete(resRbo.m_gl,local_578._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vertexParams._M_t);
  memset(&sources,0,0xac);
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  sources._193_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(sources.sources,(value_type *)&result);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(sources.sources + 1,&this->m_fragmentSrc);
  glu::ShaderProgram::ShaderProgram(&program,pRVar8,&sources);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&sources.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&sources.attribLocationBindings);
  lVar26 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&sources.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar26));
    lVar26 = lVar26 + -0x18;
  } while (lVar26 != -0x18);
  if (result.m_format != (TextureFormat)(result.m_size.m_data + 2)) {
    operator_delete((void *)result.m_format,CONCAT44(result._20_4_,result.m_size.m_data[2]) + 1);
  }
  dVar12 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p
                       );
  deRandom_init(&rnd.m_rnd,dVar12 ^ 0xbbc24);
  local_7cc = this->m_surfaceType;
  _Var22 = 0x8058;
  if (local_7cc == SURFACETYPE_FLOAT_FBO) {
    _Var22 = 0x8d70;
  }
  if (local_7cc == SURFACETYPE_DEFAULT_FRAMEBUFFER) {
    pRVar20 = Context::getRenderTarget((this->super_TestCase).m_context);
    width = 0xa7;
    if (pRVar20->m_width < 0xa7) {
      width = pRVar20->m_width;
    }
    pRVar20 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar11 = 0x67;
    if (pRVar20->m_height < 0x67) {
      iVar11 = pRVar20->m_height;
    }
    pRVar20 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar4 = pRVar20->m_width;
    dVar12 = deRandom_getUint32(&rnd.m_rnd);
    local_7f8 = dVar12 % ((iVar4 - width) + 1U);
    pRVar20 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar4 = pRVar20->m_height;
    dVar12 = deRandom_getUint32(&rnd.m_rnd);
    local_7fc = dVar12 % ((iVar4 - iVar11) + 1U);
  }
  else {
    iVar11 = 0x85;
    width = 99;
    local_7f8 = 0;
    local_7fc = 0;
  }
  fbo.m_fbo = 0;
  rbo.m_rbo = 0;
  rbo.m_gl = pFVar16;
  fbo.m_gl = pFVar16;
  tcu::TextureLevel::TextureLevel(&result);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&program);
  if (program.m_program.m_info.linkOk == false) {
    pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar19,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderDerivateTests.cpp"
               ,0x296);
LAB_0125e57c:
    __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if (local_7cc == SURFACETYPE_DEFAULT_FRAMEBUFFER) {
    pRVar20 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar4 = (pRVar20->m_pixelFormat).redBits;
    iVar5 = (pRVar20->m_pixelFormat).greenBits;
    iVar6 = (pRVar20->m_pixelFormat).blueBits;
    iVar7 = (pRVar20->m_pixelFormat).alphaBits;
    sources.sources[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    ppbVar25 = &sources.sources[0].
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppbVar25);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ppbVar25,"Rendering to default framebuffer\n",0x21);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppbVar25,"\tColor depth: R=",0x10)
    ;
    std::ostream::operator<<(ppbVar25,iVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppbVar25,", G=",4);
    std::ostream::operator<<(ppbVar25,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppbVar25,", B=",4);
    std::ostream::operator<<(ppbVar25,iVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppbVar25,", A=",4);
    std::ostream::operator<<(ppbVar25,iVar7);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&sources,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppbVar25);
    std::ios_base::~ios_base((ios_base *)(sources.sources + 5));
  }
  else {
    sources.sources[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    ppbVar25 = &sources.sources[0].
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppbVar25);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ppbVar25,"Rendering to FBO, format = ",0x1b);
    vertexParams._M_t._M_impl._0_8_ = glu::getTextureFormatName;
    vertexParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _Var22;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&vertexParams,(ostream *)ppbVar25);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppbVar25,", samples = ",0xc);
    std::ostream::operator<<(ppbVar25,this->m_numSamples);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&sources,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppbVar25);
    std::ios_base::~ios_base((ios_base *)(sources.sources + 5));
    (*(fbo.m_gl)->genFramebuffers)(1,&fbo.m_fbo);
    (*(rbo.m_gl)->genRenderbuffers)(1,&rbo.m_rbo);
    (*pFVar16->bindRenderbuffer)(0x8d41,rbo.m_rbo);
    (*pFVar16->renderbufferStorageMultisample)(0x8d41,this->m_numSamples,_Var22,width,iVar11);
    (*pFVar16->bindFramebuffer)(0x8d40,fbo.m_fbo);
    (*pFVar16->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,rbo.m_rbo);
    GVar13 = (*pFVar16->checkFramebufferStatus)(0x8d40);
    if (GVar13 != 0x8cd5) {
      pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar19,(char *)0x0,
                 "gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderDerivateTests.cpp"
                 ,0x2a6);
      goto LAB_0125e57c;
    }
  }
  resRbo.m_gl = (Functions *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  pdVar1 = &resRbo.m_rbo;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pdVar1,"in: ",4);
  tcu::operator<<((ostream *)pdVar1,&this->m_coordMin);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pdVar1," -> ",4);
  tcu::operator<<((ostream *)pdVar1,&this->m_coordMax);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pdVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pdVar1,"v_coord.x = in.x * x\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pdVar1,"v_coord.y = in.y * y\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pdVar1,"v_coord.z = in.z * (x+y)/2\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pdVar1,"v_coord.w = in.w * (1 - (x+y)/2)\n",0x21);
  resFbo.m_gl = (Functions *)
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&resRbo,(EndMessageToken *)&tcu::TestLog::EndMessage);
  pdVar1 = &resFbo.m_fbo;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pdVar1,"u_scale: ",9);
  local_7a8 = &this->m_derivScale;
  tcu::operator<<((ostream *)pdVar1,local_7a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pdVar1,", u_bias: ",10);
  vec = &this->m_derivBias;
  tcu::operator<<((ostream *)pdVar1,vec);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pdVar1," (displayed values have scale/bias removed)",0x2b);
  vertexParams._M_t._M_impl._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)&resFbo,(EndMessageToken *)&tcu::TestLog::EndMessage);
  this_00 = &vertexParams._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Viewport: ",10);
  std::ostream::operator<<(this_00,width);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"x",1);
  std::ostream::operator<<(this_00,iVar11);
  sources.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&vertexParams,
                           (EndMessageToken *)&tcu::TestLog::EndMessage);
  ppbVar25 = &sources.sources[0].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppbVar25);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)ppbVar25,"GL_FRAGMENT_SHADER_DERIVATE_HINT: ",0x22);
  local_7e8 = this->m_hint;
  __dnew = (size_type)glu::getHintModeName;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&__dnew,(ostream *)ppbVar25);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&sources,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppbVar25);
  std::ios_base::~ios_base((ios_base *)(sources.sources + 5));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  std::ios_base::~ios_base(local_210);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar1);
  std::ios_base::~ios_base(local_390);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&resRbo.m_rbo);
  std::ios_base::~ios_base(local_510);
  local_258[0]._M_allocated_capacity = 0x3f8000003f800000;
  local_258[0]._8_8_ = 0x3f80000000000000;
  vertexParams._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0xbf8000003f800000
  ;
  vertexParams._M_t._M_impl.super__Rb_tree_header._M_node_count = 0x3f80000000000000;
  vertexParams._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x3f800000bf800000;
  vertexParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x3f80000000000000;
  vertexParams._M_t._M_impl._0_8_ = 0xbf800000bf800000;
  vertexParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vertexParams._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
  resFbo.m_gl = *(Functions **)(this->m_coordMin).m_data;
  uVar3 = *(undefined8 *)((this->m_coordMin).m_data + 2);
  fVar27 = (float)uVar3;
  local_3cc = (float)((ulong)uVar3 >> 0x20);
  uVar3 = *(undefined8 *)((this->m_coordMax).m_data + 2);
  local_3d0 = (float)uVar3;
  fVar28 = (float)((ulong)uVar3 >> 0x20);
  fVar29 = (local_3d0 + fVar27) * 0.5;
  fVar30 = (fVar28 + local_3cc) * 0.5;
  resFbo._12_4_ = fVar28;
  resFbo.m_fbo = (deUint32)fVar27;
  local_3f8._8_8_ = CONCAT44(fVar30,fVar29);
  local_3e4 = (undefined4)((ulong)resFbo.m_gl >> 0x20);
  local_3e0._4_4_ = fVar30;
  local_3e0._0_4_ = fVar29;
  local_3d8._0_4_ = (this->m_coordMax).m_data[0];
  local_3d8._4_4_ = (this->m_coordMax).m_data[1];
  local_3f8._M_allocated_capacity = CONCAT44(local_3d8._4_4_,(int)resFbo.m_gl);
  __dnew = (size_type)&local_7e0;
  local_3e8 = (undefined4)local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__dnew,"a_position","");
  resRbo.m_gl = (Functions *)CONCAT44(resRbo.m_gl._4_4_,1);
  lVar26 = (long)&local_578 + 8;
  resRbo._8_8_ = lVar26;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&resRbo.m_rbo,__dnew,CONCAT44(uStack_7e4,local_7e8) + __dnew);
  sources.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(sources.sources + 1);
  local_560 = 0;
  sources.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(sources.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,resRbo.m_gl._0_4_);
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             &sources.sources[0].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,resRbo._8_8_,
             local_578._M_allocated_capacity + resRbo._8_8_);
  sources.sources[1].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = local_560;
  sources.sources[2].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 8;
  sources.sources[2].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
  sources.sources[2].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 4;
  sources.sources[2].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 4;
  sources.sources[2].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  sources.sources[3].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&vertexParams;
  if (resRbo._8_8_ != lVar26) {
    operator_delete((void *)resRbo._8_8_,local_578._8_8_ + 1);
  }
  transferFormat = (TextureFormat)&local_7b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&transferFormat,"a_coord","");
  resRbo.m_gl = (Functions *)CONCAT44(resRbo.m_gl._4_4_,1);
  resRbo._8_8_ = lVar26;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&resRbo.m_rbo,transferFormat,local_7c0 + (long)transferFormat);
  local_560 = 0;
  sources.sources[3].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = resRbo.m_gl._0_4_;
  ppbVar25 = &sources.sources[4].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  sources.sources[3].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ppbVar25;
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             &sources.sources[3].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,resRbo._8_8_,
             local_578._M_allocated_capacity + resRbo._8_8_);
  sources.sources[5].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = local_560;
  sources.sources[5].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x8;
  sources.sources[5].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x400000004;
  sources.attribLocationBindings.
  super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  sources.attribLocationBindings.
  super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)&resFbo;
  if (resRbo._8_8_ != lVar26) {
    operator_delete((void *)resRbo._8_8_,local_578._8_8_ + 1);
  }
  if (transferFormat != (TextureFormat)&local_7b8) {
    operator_delete((void *)transferFormat,local_7b8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__dnew != &local_7e0) {
    operator_delete((void *)__dnew,local_7e0._M_allocated_capacity + 1);
  }
  __dnew = 0x2000100020000;
  local_7e8 = 0x10003;
  (*pFVar16->clearColor)(0.125,0.25,0.5,1.0);
  (*pFVar16->clear)(0x4500);
  (*pFVar16->disable)(0xbd0);
  (*pFVar16->useProgram)(program.m_program.m_program);
  GVar14 = (*pFVar16->getUniformLocation)(program.m_program.m_program,"u_scale");
  GVar15 = (*pFVar16->getUniformLocation)(program.m_program.m_program,"u_bias");
  switch(this->m_dataType) {
  case TYPE_FLOAT:
    (*pFVar16->uniform1f)(GVar14,local_7a8->m_data[0]);
    (*pFVar16->uniform1f)(GVar15,vec->m_data[0]);
    goto switchD_0125dbe3_default;
  case TYPE_FLOAT_VEC2:
    (*pFVar16->uniform2fv)(GVar14,1,local_7a8->m_data);
    pp_Var21 = &pFVar16->uniform2fv;
    break;
  case TYPE_FLOAT_VEC3:
    (*pFVar16->uniform3fv)(GVar14,1,local_7a8->m_data);
    pp_Var21 = &pFVar16->uniform3fv;
    break;
  case TYPE_FLOAT_VEC4:
    (*pFVar16->uniform4fv)(GVar14,1,local_7a8->m_data);
    pp_Var21 = &pFVar16->uniform4fv;
    break;
  default:
    goto switchD_0125dbe3_default;
  }
  (**pp_Var21)(GVar15,1,vec->m_data);
switchD_0125dbe3_default:
  deqp::gls::setupDefaultUniforms
            (((this->super_TestCase).m_context)->m_renderCtx,program.m_program.m_program);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,(ulong)program.m_program.m_program);
  (*pFVar16->hint)(0x8b8b,this->m_hint);
  GVar13 = (*pFVar16->getError)();
  glu::checkError(GVar13,"Setup program state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderDerivateTests.cpp"
                  ,0x2fd);
  (*pFVar16->viewport)(local_7f8,local_7fc,width,iVar11);
  resRbo.m_gl = (Functions *)0x600000000;
  resRbo.m_rbo = 1;
  local_578._M_allocated_capacity = (size_type)(string *)&__dnew;
  glu::draw(((this->super_TestCase).m_context)->m_renderCtx,program.m_program.m_program,2,
            (VertexArrayBinding *)&sources,(PrimitiveList *)&resRbo,(DrawUtilCallback *)0x0);
  GVar13 = (*pFVar16->getError)();
  glu::checkError(GVar13,"Draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderDerivateTests.cpp"
                  ,0x302);
  lVar26 = -0xa0;
  do {
    if ((pointer)ppbVar25 != ppbVar25[-2]) {
      operator_delete(ppbVar25[-2],(ulong)((long)&((*ppbVar25)->_M_dataplus)._M_p + 1));
    }
    ppbVar25 = ppbVar25 + -10;
    lVar26 = lVar26 + 0x50;
  } while (lVar26 != 0);
  resFbo._8_8_ = resFbo._8_8_ & 0xffffffff00000000;
  resRbo._8_8_ = resRbo._8_8_ & 0xffffffff00000000;
  resRbo.m_gl = pFVar16;
  resFbo.m_gl = pFVar16;
  if ((local_7cc != SURFACETYPE_DEFAULT_FRAMEBUFFER) && (0 < this->m_numSamples)) {
    (*pFVar16->genFramebuffers)(1,&resFbo.m_fbo);
    (*(resRbo.m_gl)->genRenderbuffers)(1,&resRbo.m_rbo);
    (*pFVar16->bindRenderbuffer)(0x8d41,resRbo.m_rbo);
    (*pFVar16->renderbufferStorageMultisample)(0x8d41,0,_Var22,width,iVar11);
    (*pFVar16->bindFramebuffer)(0x8ca9,resFbo.m_fbo);
    (*pFVar16->framebufferRenderbuffer)(0x8ca9,0x8ce0,0x8d41,resRbo.m_rbo);
    GVar13 = (*pFVar16->checkFramebufferStatus)(0x8d40);
    if (GVar13 != 0x8cd5) {
      pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar19,(char *)0x0,
                 "gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderDerivateTests.cpp"
                 ,0x315);
      __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (*pFVar16->blitFramebuffer)(0,0,width,iVar11,0,0,width,iVar11,0x4000,0x2600);
    GVar13 = (*pFVar16->getError)();
    glu::checkError(GVar13,"Resolve blit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderDerivateTests.cpp"
                    ,0x318);
    (*pFVar16->bindFramebuffer)(0x8ca8,resFbo.m_fbo);
  }
  if (this->m_surfaceType < SURFACETYPE_FLOAT_FBO) {
    sources.sources[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x300000008;
    tcu::TextureLevel::setStorage(&result,(TextureFormat *)&sources,width,iVar11,1);
    pRVar8 = ((this->super_TestCase).m_context)->m_renderCtx;
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&sources,&result);
    glu::readPixels(pRVar8,local_7f8,local_7fc,(PixelBufferAccess *)&sources);
  }
  else if (this->m_surfaceType == SURFACETYPE_FLOAT_FBO) {
    __dnew = 0x2300000008;
    transferFormat.order = RGBA;
    transferFormat.type = UNSIGNED_INT32;
    tcu::TextureLevel::setStorage(&result,(TextureFormat *)&__dnew,width,iVar11,1);
    iVar4 = result.m_size.m_data[1];
    iVar11 = result.m_size.m_data[0];
    pRVar8 = ((this->super_TestCase).m_context)->m_renderCtx;
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&vertexParams,&result);
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&sources,&transferFormat,iVar11,iVar4,result.m_size.m_data[2],
               vertexParams._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
    glu::readPixels(pRVar8,local_7f8,local_7fc,(PixelBufferAccess *)&sources);
  }
  GVar13 = (*pFVar16->getError)();
  glu::checkError(GVar13,"Read pixels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderDerivateTests.cpp"
                  ,0x334);
  if (resRbo.m_rbo != 0) {
    (*(resRbo.m_gl)->deleteRenderbuffers)(1,&resRbo.m_rbo);
  }
  if (resFbo.m_fbo != 0) {
    (*(resFbo.m_gl)->deleteFramebuffers)(1,&resFbo.m_fbo);
  }
  tcu::Surface::Surface(&errorMask,result.m_size.m_data[0],result.m_size.m_data[1]);
  vertexParams._M_t._M_impl._0_8_ = 0x300000008;
  data = (void *)errorMask.m_pixels.m_cap;
  if (errorMask.m_pixels.m_cap != 0) {
    data = errorMask.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&sources,(TextureFormat *)&vertexParams,errorMask.m_width,
             errorMask.m_height,1,data);
  resFbo.m_gl = (Functions *)CONCAT44(resFbo.m_gl._4_4_,0xff00ff00);
  tcu::RGBA::toVec((RGBA *)&resFbo);
  tcu::clear((PixelBufferAccess *)&sources,(Vec4 *)&vertexParams);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&sources,&result);
  resFbo.m_gl = (Functions *)0x300000008;
  if (errorMask.m_pixels.m_cap != 0) {
    errorMask.m_pixels.m_cap = (size_t)errorMask.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&vertexParams,(TextureFormat *)&resFbo,errorMask.m_width,
             errorMask.m_height,1,(void *)errorMask.m_pixels.m_cap);
  iVar11 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                     (this,&sources,&vertexParams);
  pTVar9 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  resRbo.m_gl = (Functions *)&local_578;
  std::__cxx11::string::_M_construct<char_const*>((string *)&resRbo,"Result","");
  __dnew = (size_type)&local_7e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__dnew,"Result images","");
  tcu::LogImageSet::LogImageSet((LogImageSet *)&vertexParams,(string *)&resRbo,(string *)&__dnew);
  tcu::TestLog::startImageSet
            (pTVar9,(char *)vertexParams._M_t._M_impl._0_8_,
             (char *)vertexParams._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
  transferFormat = (TextureFormat)&local_7b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&transferFormat,"Rendered","");
  local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_738,"Rendered image","");
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess((ConstPixelBufferAccess *)&resFbo,&result);
  access = (ConstPixelBufferAccess *)&resFbo;
  tcu::LogImage::LogImage
            ((LogImage *)&sources,(string *)&transferFormat,&local_738,access,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)&sources,(int)pTVar9,__buf,(size_t)access);
  if (sources.sources[1].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)(sources.sources + 2)) {
    operator_delete(sources.sources[1].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
                    CONCAT44(sources.sources[2].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             sources.sources[2].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_4_) + 1);
  }
  ppbVar25 = &sources.sources[0].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (sources.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar25) {
    operator_delete(sources.sources[0].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((sources.sources[0].
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_738._M_dataplus._M_p != &local_738.field_2) {
    operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
  }
  if (transferFormat != (TextureFormat)&local_7b8) {
    operator_delete((void *)transferFormat,local_7b8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vertexParams._M_t._M_impl.super__Rb_tree_header._M_header._M_right != local_258) {
    operator_delete(vertexParams._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
                    local_258[0]._M_allocated_capacity + 1);
  }
  pp_Var2 = &vertexParams._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if ((_Base_ptr *)vertexParams._M_t._M_impl._0_8_ != pp_Var2) {
    operator_delete((void *)vertexParams._M_t._M_impl._0_8_,
                    (ulong)((long)&(vertexParams._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__dnew != &local_7e0) {
    operator_delete((void *)__dnew,local_7e0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)resRbo.m_gl != &local_578) {
    operator_delete(resRbo.m_gl,(ulong)(local_578._M_allocated_capacity + 1));
  }
  bVar24 = (byte)iVar11;
  if (bVar24 == 0) {
    pTVar9 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    vertexParams._M_t._M_impl._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&vertexParams,"ErrorMask","");
    resFbo.m_gl = (Functions *)&local_3f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&resFbo,"Error mask","");
    surface = &errorMask;
    tcu::LogImage::LogImage
              ((LogImage *)&sources,(string *)&vertexParams,(string *)&resFbo,surface,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&sources,(int)pTVar9,__buf_00,(size_t)surface);
    if (sources.sources[1].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)(sources.sources + 2)) {
      operator_delete(sources.sources[1].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
                      CONCAT44(sources.sources[2].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                               sources.sources[2].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_4_) + 1);
    }
    if (sources.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar25) {
      operator_delete(sources.sources[0].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((sources.sources[0].
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)resFbo.m_gl != &local_3f8) {
      operator_delete(resFbo.m_gl,local_3f8._M_allocated_capacity + 1);
    }
    if ((_Base_ptr *)vertexParams._M_t._M_impl._0_8_ != pp_Var2) {
      operator_delete((void *)vertexParams._M_t._M_impl._0_8_,
                      (ulong)((long)&(vertexParams._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
  }
  tcu::TestLog::endImageSet(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log)
  ;
  pcVar23 = "Image comparison failed";
  if (bVar24 != 0) {
    pcVar23 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(bVar24 ^ 1),
             pcVar23);
  tcu::Surface::~Surface(&errorMask);
  tcu::TextureLevel::~TextureLevel(&result);
  if (rbo.m_rbo != 0) {
    (*(rbo.m_gl)->deleteRenderbuffers)(1,&rbo.m_rbo);
  }
  if (fbo.m_fbo != 0) {
    (*(fbo.m_gl)->deleteFramebuffers)(1,&fbo.m_fbo);
  }
  glu::ShaderProgram::~ShaderProgram(&program);
  return STOP;
}

Assistant:

TriangleDerivateCase::IterateResult TriangleDerivateCase::iterate (void)
{
	const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
	const glu::ShaderProgram	program			(m_context.getRenderContext(), glu::makeVtxFragSources(genVertexSource(m_coordDataType, m_coordPrecision), m_fragmentSrc));
	de::Random					rnd				(deStringHash(getName()) ^ 0xbbc24);
	const bool					useFbo			= m_surfaceType != SURFACETYPE_DEFAULT_FRAMEBUFFER;
	const deUint32				fboFormat		= m_surfaceType == SURFACETYPE_FLOAT_FBO ? GL_RGBA32UI : GL_RGBA8;
	const tcu::IVec2			viewportSize	= getViewportSize();
	const int					viewportX		= useFbo ? 0 : rnd.getInt(0, m_context.getRenderTarget().getWidth()		- viewportSize.x());
	const int					viewportY		= useFbo ? 0 : rnd.getInt(0, m_context.getRenderTarget().getHeight()	- viewportSize.y());
	AutoFbo						fbo				(gl);
	AutoRbo						rbo				(gl);
	tcu::TextureLevel			result;

	m_testCtx.getLog() << program;

	if (!program.isOk())
		TCU_FAIL("Compile failed");

	if (useFbo)
	{
		m_testCtx.getLog() << TestLog::Message
						   << "Rendering to FBO, format = " << glu::getTextureFormatStr(fboFormat)
						   << ", samples = " << m_numSamples
						   << TestLog::EndMessage;

		fbo.gen();
		rbo.gen();

		gl.bindRenderbuffer(GL_RENDERBUFFER, *rbo);
		gl.renderbufferStorageMultisample(GL_RENDERBUFFER, m_numSamples, fboFormat, viewportSize.x(), viewportSize.y());
		gl.bindFramebuffer(GL_FRAMEBUFFER, *fbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *rbo);
		TCU_CHECK(gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);
	}
	else
	{
		const tcu::PixelFormat pixelFormat = m_context.getRenderTarget().getPixelFormat();

		m_testCtx.getLog()
			<< TestLog::Message
			<< "Rendering to default framebuffer\n"
			<< "\tColor depth: R=" << pixelFormat.redBits << ", G=" << pixelFormat.greenBits << ", B=" << pixelFormat.blueBits << ", A=" << pixelFormat.alphaBits
			<< TestLog::EndMessage;
	}

	m_testCtx.getLog() << TestLog::Message << "in: " << m_coordMin << " -> " << m_coordMax << "\n"
										   << "v_coord.x = in.x * x\n"
										   << "v_coord.y = in.y * y\n"
										   << "v_coord.z = in.z * (x+y)/2\n"
										   << "v_coord.w = in.w * (1 - (x+y)/2)\n"
					   << TestLog::EndMessage
					   << TestLog::Message << "u_scale: " << m_derivScale << ", u_bias: " << m_derivBias << " (displayed values have scale/bias removed)" << TestLog::EndMessage
					   << TestLog::Message << "Viewport: " << viewportSize.x() << "x" << viewportSize.y() << TestLog::EndMessage
					   << TestLog::Message << "GL_FRAGMENT_SHADER_DERIVATE_HINT: " << glu::getHintModeStr(m_hint) << TestLog::EndMessage;

	// Draw
	{
		const float positions[] =
		{
			-1.0f, -1.0f, 0.0f, 1.0f,
			-1.0f,  1.0f, 0.0f, 1.0f,
			 1.0f, -1.0f, 0.0f, 1.0f,
			 1.0f,  1.0f, 0.0f, 1.0f
		};
		const float coords[] =
		{
			m_coordMin.x(), m_coordMin.y(), m_coordMin.z(),							m_coordMax.w(),
			m_coordMin.x(), m_coordMax.y(), (m_coordMin.z()+m_coordMax.z())*0.5f,	(m_coordMin.w()+m_coordMax.w())*0.5f,
			m_coordMax.x(), m_coordMin.y(), (m_coordMin.z()+m_coordMax.z())*0.5f,	(m_coordMin.w()+m_coordMax.w())*0.5f,
			m_coordMax.x(), m_coordMax.y(), m_coordMax.z(),							m_coordMin.w()
		};
		const glu::VertexArrayBinding vertexArrays[] =
		{
			glu::va::Float("a_position",	4, 4, 0, &positions[0]),
			glu::va::Float("a_coord",		4, 4, 0, &coords[0])
		};
		const deUint16 indices[] = { 0, 2, 1, 2, 3, 1 };

		gl.clearColor(0.125f, 0.25f, 0.5f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
		gl.disable(GL_DITHER);

		gl.useProgram(program.getProgram());

		{
			const int	scaleLoc	= gl.getUniformLocation(program.getProgram(), "u_scale");
			const int	biasLoc		= gl.getUniformLocation(program.getProgram(), "u_bias");

			switch (m_dataType)
			{
				case glu::TYPE_FLOAT:
					gl.uniform1f(scaleLoc, m_derivScale.x());
					gl.uniform1f(biasLoc, m_derivBias.x());
					break;

				case glu::TYPE_FLOAT_VEC2:
					gl.uniform2fv(scaleLoc, 1, m_derivScale.getPtr());
					gl.uniform2fv(biasLoc, 1, m_derivBias.getPtr());
					break;

				case glu::TYPE_FLOAT_VEC3:
					gl.uniform3fv(scaleLoc, 1, m_derivScale.getPtr());
					gl.uniform3fv(biasLoc, 1, m_derivBias.getPtr());
					break;

				case glu::TYPE_FLOAT_VEC4:
					gl.uniform4fv(scaleLoc, 1, m_derivScale.getPtr());
					gl.uniform4fv(biasLoc, 1, m_derivBias.getPtr());
					break;

				default:
					DE_ASSERT(false);
			}
		}

		gls::setupDefaultUniforms(m_context.getRenderContext(), program.getProgram());
		setupRenderState(program.getProgram());

		gl.hint(GL_FRAGMENT_SHADER_DERIVATIVE_HINT, m_hint);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Setup program state");

		gl.viewport(viewportX, viewportY, viewportSize.x(), viewportSize.y());
		glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), &vertexArrays[0],
				  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");
	}

	// Read back results
	{
		const bool		isMSAA		= useFbo && m_numSamples > 0;
		AutoFbo			resFbo		(gl);
		AutoRbo			resRbo		(gl);

		// Resolve if necessary
		if (isMSAA)
		{
			resFbo.gen();
			resRbo.gen();

			gl.bindRenderbuffer(GL_RENDERBUFFER, *resRbo);
			gl.renderbufferStorageMultisample(GL_RENDERBUFFER, 0, fboFormat, viewportSize.x(), viewportSize.y());
			gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, *resFbo);
			gl.framebufferRenderbuffer(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *resRbo);
			TCU_CHECK(gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

			gl.blitFramebuffer(0, 0, viewportSize.x(), viewportSize.y(), 0, 0, viewportSize.x(), viewportSize.y(), GL_COLOR_BUFFER_BIT, GL_NEAREST);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Resolve blit");

			gl.bindFramebuffer(GL_READ_FRAMEBUFFER, *resFbo);
		}

		switch (m_surfaceType)
		{
			case SURFACETYPE_DEFAULT_FRAMEBUFFER:
			case SURFACETYPE_UNORM_FBO:
				result.setStorage(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), viewportSize.x(), viewportSize.y());
				glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, result);
				break;

			case SURFACETYPE_FLOAT_FBO:
			{
				const tcu::TextureFormat	dataFormat		(tcu::TextureFormat::RGBA, tcu::TextureFormat::FLOAT);
				const tcu::TextureFormat	transferFormat	(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNSIGNED_INT32);

				result.setStorage(dataFormat, viewportSize.x(), viewportSize.y());
				glu::readPixels(m_context.getRenderContext(), viewportX, viewportY,
								tcu::PixelBufferAccess(transferFormat, result.getWidth(), result.getHeight(), result.getDepth(), result.getAccess().getDataPtr()));
				break;
			}

			default:
				DE_ASSERT(false);
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels");
	}

	// Verify
	{
		tcu::Surface errorMask(result.getWidth(), result.getHeight());
		tcu::clear(errorMask.getAccess(), tcu::RGBA::green().toVec());

		const bool isOk = verify(result.getAccess(), errorMask.getAccess());

		m_testCtx.getLog() << TestLog::ImageSet("Result", "Result images")
						   << TestLog::Image("Rendered", "Rendered image", result);

		if (!isOk)
			m_testCtx.getLog() << TestLog::Image("ErrorMask", "Error mask", errorMask);

		m_testCtx.getLog() << TestLog::EndImageSet;

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Image comparison failed");
	}

	return STOP;
}